

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

bool OpenMD::hasDuplicateElement<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *cont)

{
  pointer piVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  vector<int,_std::allocator<int>_> tmp;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_28,cont);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_28._M_impl.super__Vector_impl_data._M_start,
             local_28._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_28._M_impl.super__Vector_impl_data._M_start,
                       local_28._M_impl.super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)&local_28,(const_iterator)__first._M_current,
             (const_iterator)local_28._M_impl.super__Vector_impl_data._M_finish);
  piVar1 = (cont->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = (cont->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return (long)local_28._M_impl.super__Vector_impl_data._M_finish -
         (long)local_28._M_impl.super__Vector_impl_data._M_start != (long)piVar1 - (long)piVar2;
}

Assistant:

bool hasDuplicateElement(const ContainerType& cont) {
    ContainerType tmp = cont;
    std::sort(tmp.begin(), tmp.end());
    tmp.erase(std::unique(tmp.begin(), tmp.end()), tmp.end());
    return tmp.size() != cont.size();
  }